

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O2

void __thiscall
validation_layer::parameterValidationChecker::parameterValidationChecker
          (parameterValidationChecker *this)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  context_t *pcVar4;
  validationChecker *local_20;
  
  this->enableParameterValidation = false;
  bVar1 = getenv_tobool("ZE_ENABLE_PARAMETER_VALIDATION");
  this->enableParameterValidation = bVar1;
  if (bVar1) {
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = &PTR_zeInitPrologue_001d7778;
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = &PTR_zesInitPrologue_001d8460;
    DAT_001dc710 = (undefined8 *)operator_new(8);
    *DAT_001dc710 = &PTR_zetModuleGetDebugInfoPrologue_001d8de8;
    parameterChecker = puVar2;
    DAT_001dc708 = puVar3;
    pcVar4 = context_t::getInstance();
    local_20 = (validationChecker *)&parameterChecker;
    std::
    vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
    ::emplace_back<validation_layer::validationChecker*>
              ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                *)&pcVar4->validationHandlers,&local_20);
  }
  return;
}

Assistant:

parameterValidationChecker::parameterValidationChecker() {
        enableParameterValidation = getenv_tobool( "ZE_ENABLE_PARAMETER_VALIDATION" );
        if(enableParameterValidation) {
            ZEParameterValidation *zeChecker = new ZEParameterValidation;
            ZESParameterValidation *zesChecker = new ZESParameterValidation;
            ZETParameterValidation *zetChecker = new ZETParameterValidation;
            parameterChecker.zeValidation = zeChecker;
            parameterChecker.zetValidation = zetChecker;
            parameterChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&parameterChecker);
        }
    }